

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O2

int CVmObjString::getp_splice(vm_val_t *retval,vm_val_t *self_val,char *str,uint *argc)

{
  ushort uVar1;
  anon_union_8_8_cb74652f_for_val aVar2;
  undefined4 uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  vm_obj_id_t vVar7;
  size_t sVar8;
  ushort *puVar9;
  size_t sVar10;
  vm_val_t *pvVar11;
  char *p;
  uint uVar12;
  size_t __n;
  int iVar13;
  uint uVar14;
  void *__dest;
  vm_val_t new_ins_str;
  char ins_buf [128];
  
  if (argc == (uint *)0x0) {
    uVar12 = 0;
  }
  else {
    uVar12 = *argc;
  }
  if (getp_splice(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc == '\0') {
    iVar4 = __cxa_guard_acquire(&getp_splice(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::
                                 desc);
    if (iVar4 != 0) {
      getp_splice::desc.min_argc_ = 2;
      getp_splice::desc.opt_argc_ = 1;
      getp_splice::desc.varargs_ = 0;
      __cxa_guard_release(&getp_splice(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc);
    }
  }
  iVar4 = CVmObject::get_prop_check_argc(retval,argc,&getp_splice::desc);
  if (iVar4 == 0) {
    iVar5 = CVmBif::pop_int_val();
    iVar6 = CVmBif::pop_int_val();
    uVar1 = *(ushort *)str;
    p = str + 2;
    sVar8 = utf8_ptr::s_len(p,(ulong)uVar1);
    iVar13 = (int)sVar8;
    iVar4 = -1;
    if (iVar5 < 0) {
      iVar4 = iVar13;
    }
    iVar4 = iVar4 + iVar5;
    iVar5 = iVar13;
    if (iVar4 < iVar13) {
      iVar5 = iVar4;
    }
    if (iVar4 < 0) {
      iVar5 = 0;
    }
    iVar4 = iVar13 - iVar5;
    if (iVar6 < iVar13 - iVar5) {
      iVar4 = iVar6;
    }
    if (iVar6 < 0) {
      iVar4 = 0;
    }
    sVar8 = utf8_ptr::s_bytelen(p,(long)iVar5);
    pvVar11 = sp_;
    uVar3 = *(undefined4 *)&self_val->field_0x4;
    aVar2 = self_val->val;
    sp_ = sp_ + 1;
    pvVar11->typ = self_val->typ;
    *(undefined4 *)&pvVar11->field_0x4 = uVar3;
    pvVar11->val = aVar2;
    new_ins_str.typ = VM_NIL;
    if ((uVar12 < 3) || (sp_[-2].typ == VM_NIL)) {
      __n = 0;
      puVar9 = (ushort *)0x0;
      pvVar11 = sp_;
    }
    else {
      puVar9 = (ushort *)cvt_to_str(&new_ins_str,ins_buf,0x80,sp_ + -2,10,0);
      __n = (size_t)*puVar9;
      puVar9 = puVar9 + 1;
      pvVar11 = sp_;
    }
    sp_ = pvVar11 + 1;
    *(ulong *)pvVar11 = CONCAT44(new_ins_str._4_4_,new_ins_str.typ);
    pvVar11->val = new_ins_str.val;
    if ((iVar4 == 0) && (__n == 0)) {
      uVar3 = *(undefined4 *)&self_val->field_0x4;
      aVar2 = self_val->val;
      retval->typ = self_val->typ;
      *(undefined4 *)&retval->field_0x4 = uVar3;
      retval->val = aVar2;
    }
    else {
      sVar10 = utf8_ptr::s_bytelen(p + sVar8,(long)iVar4);
      vVar7 = create(0,(uVar1 + __n) - sVar10);
      retval->typ = VM_OBJ;
      (retval->val).obj = vVar7;
      __dest = (void *)(*(long *)((long)&G_obj_table_X.pages_[vVar7 >> 0xc][vVar7 & 0xfff].ptr_ + 8)
                       + 2);
      if (sVar8 != 0) {
        memcpy(__dest,p,sVar8);
        __dest = (void *)((long)__dest + sVar8);
      }
      if (__n != 0) {
        memcpy(__dest,puVar9,__n);
        __dest = (void *)((long)__dest + __n);
      }
      uVar14 = (uint)uVar1 - (int)(sVar10 + sVar8);
      if (0 < (int)uVar14) {
        memcpy(__dest,p + sVar10 + sVar8,(ulong)(uVar14 & 0x7fffffff));
      }
    }
    sp_ = sp_ + -(long)(int)uVar12;
  }
  return 1;
}

Assistant:

int CVmObjString::getp_splice(VMG_ vm_val_t *retval,
                              const vm_val_t *self_val,
                              const char *str, uint *argc)
{
    char ins_buf[128];

    /* check arguments */
    uint oargc = (argc != 0 ? *argc : 0);
    static CVmNativeCodeDesc desc(2, 1);
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* retrieve the starting index and deletion length */
    int start_idx = CVmBif::pop_int_val(vmg0_);
    int del_char_len = CVmBif::pop_int_val(vmg0_);

    /* get and skip our length */
    size_t len = vmb_get_len(str);
    str += VMB_LEN;
    utf8_ptr p((char *)str);
    int charlen = p.len(len);

    /* adjust the index to 0-based, and figure end-of-string offsets */
    start_idx += (start_idx < 0 ? charlen : -1);

    /* make sure the starting index and deletion length are in bounds */
    start_idx = (start_idx < 0 ? 0 :
                 start_idx > (int)charlen ? charlen :
                 start_idx);
    del_char_len = (del_char_len < 0 ? 0 :
                    del_char_len > (int)(charlen - start_idx) ? charlen - start_idx :
                    del_char_len);

    /* get the starting byte index */
    size_t start_byte_idx = p.bytelen(start_idx);

    /* save 'self' as gc protection */
    G_stk->push(self_val);
    
    /* 
     *   If there's an insertion string, get it as a string.  Treat nil as an
     *   empty insertion.  
     */
    size_t ins_byte_len = 0;
    const char *ins = 0;
    vm_val_t new_ins_str;
    new_ins_str.set_nil();
    if (oargc >= 3 && G_stk->get(1)->typ != VM_NIL)
    {
        /* 
         *   Leave the insertion string on the stack for gc protection, and
         *   do an explicit conversion to string.  
         */
        ins = cvt_to_str(vmg_ &new_ins_str, ins_buf, sizeof(ins_buf),
                         G_stk->get(1), 10, 0);
        ins_byte_len = vmb_get_len(ins);
        ins += VMB_LEN;
    }

    /* push the new insertion string (if any) for gc protection */
    G_stk->push(&new_ins_str);

    /* check to see if we're making any changes */
    if (del_char_len != 0 || ins_byte_len != 0)
    {
        /* figure the byte length to be deleted */
        size_t del_byte_len = utf8_ptr::s_bytelen(str + start_byte_idx, del_char_len);

        /* allocate a new string at the proper length */
        retval->set_obj(create(vmg_ FALSE, len + ins_byte_len - del_byte_len));
        CVmObjString *new_str = (CVmObjString *)vm_objp(vmg_ retval->val.obj);
        char *newp = new_str->cons_get_buf();

        /* copy the part of our string up to the starting index */
        if (start_byte_idx > 0)
        {
            memcpy(newp, str, start_byte_idx);
            newp += start_byte_idx;
        }

        /* if we have an insertion string, copy it */
        if (ins_byte_len != 0)
        {
            memcpy(newp, ins, ins_byte_len);
            newp += ins_byte_len;
        }

        /* if there's anything after the deleted section, add it */
        size_t tail_byte_idx = start_byte_idx + del_byte_len;
        int tail_byte_len = len - tail_byte_idx;
        if (tail_byte_len > 0)
            memcpy(newp, str + tail_byte_idx, tail_byte_len);
    }
    else
    {
        /* we're making no changes - return the original string */
        *retval = *self_val;
    }

    /* 
     *   discard the remaining arguments and the gc protection (original
     *   argc, minus 2 arg pops, plus 2 gc protection pushes -> oargc) 
     */
    G_stk->discard(oargc); 

    /* handled */
    return TRUE;
}